

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O1

int debug_cond_wait(void *cond_,void *lock_,timeval *tv)

{
  int iVar1;
  unsigned_long uVar2;
  debug_lock *lock;
  debug_lock *lock_00;
  
  if (lock_ == (void *)0x0) {
    debug_cond_wait_cold_2();
  }
  else if (*lock_ == -0x214f4ef4) {
    if (evthread_lock_debugging_enabled_ == 0) {
LAB_002547a8:
      evthread_debug_lock_mark_unlocked(0,(debug_lock *)lock_);
      lock_00 = *(debug_lock **)((long)lock_ + 0x18);
      iVar1 = (*original_cond_fns_.wait_condition)(cond_,lock_00,tv);
      evthread_debug_lock_mark_locked((uint)lock_,lock_00);
      return iVar1;
    }
    if (*(int *)((long)lock_ + 0x10) != 0) {
      if (evthread_id_fn_ != (_func_unsigned_long *)0x0) {
        uVar2 = (*evthread_id_fn_)();
        if (*(unsigned_long *)((long)lock_ + 8) != uVar2) goto LAB_002547e3;
      }
      goto LAB_002547a8;
    }
    goto LAB_002547e3;
  }
  debug_cond_wait_cold_1();
LAB_002547e3:
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
             ,0x12f,"evthread_is_debug_lock_held_(lock_)","debug_cond_wait");
}

Assistant:

static int
debug_cond_wait(void *cond_, void *lock_, const struct timeval *tv)
{
	int r;
	struct debug_lock *lock = lock_;
	EVUTIL_ASSERT(lock);
	EVUTIL_ASSERT(DEBUG_LOCK_SIG == lock->signature);
	EVLOCK_ASSERT_LOCKED(lock_);
	evthread_debug_lock_mark_unlocked(0, lock);
	r = original_cond_fns_.wait_condition(cond_, lock->lock, tv);
	evthread_debug_lock_mark_locked(0, lock);
	return r;
}